

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O1

int __thiscall bdHashSet::modify(bdHashSet *this,string *key,bdHashEntry *entry,uint32_t modFlags)

{
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
  *this_00;
  _Rb_tree_header *__y;
  _Base_ptr p_Var1;
  pointer pcVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  iterator __position;
  iterator iVar7;
  time_t store;
  _Self __tmp;
  bool bVar8;
  bdHashEntry newEntry;
  string local_130;
  string local_110;
  bdHashEntry local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>
  local_a0;
  
  this_00 = &this->mEntries;
  __y = &(this->mEntries)._M_t._M_impl.super__Rb_tree_header;
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
               ::_M_lower_bound(&this_00->_M_t,
                                (_Link_type)
                                (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&__y->_M_header,key);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
          ::_M_upper_bound(&this_00->_M_t,
                           (_Link_type)
                           (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                           &__y->_M_header,key);
  bVar3 = 0;
  store = time((time_t *)0x0);
  if (__position._M_node != iVar7._M_node) {
    bVar3 = 0;
    do {
      p_Var1 = __position._M_node[2]._M_parent;
      if ((p_Var1 == (_Base_ptr)(entry->mValue)._M_string_length) &&
         ((p_Var1 == (_Base_ptr)0x0 ||
          (iVar5 = bcmp(*(void **)(__position._M_node + 2),(entry->mValue)._M_dataplus._M_p,
                        (size_t)p_Var1), iVar5 == 0)))) {
        iVar5 = std::__cxx11::string::compare((char *)&__position._M_node[3]._M_parent);
        p_Var1 = __position._M_node[3]._M_left;
        if (p_Var1 == (_Base_ptr)(entry->mSecret)._M_string_length) {
          if (p_Var1 == (_Base_ptr)0x0) {
            bVar8 = true;
          }
          else {
            iVar6 = bcmp(__position._M_node[3]._M_parent,(entry->mSecret)._M_dataplus._M_p,
                         (size_t)p_Var1);
            bVar8 = iVar6 == 0;
          }
        }
        else {
          bVar8 = false;
        }
        if ((iVar5 == 0) && (bVar8)) {
          bVar4 = true;
          if ((modFlags == 1) &&
             ((long)&(__position._M_node[4]._M_parent)->_M_color + *(long *)(__position._M_node + 3)
              < entry->mLifetime + store)) {
LAB_0012a034:
            *(time_t *)(__position._M_node + 3) = store;
            __position._M_node[4]._M_parent = (_Base_ptr)entry->mLifetime;
            bVar4 = true;
            bVar3 = 1;
          }
        }
        else {
          bVar4 = true;
          if (bVar8) {
            if (modFlags == 1) goto LAB_0012a034;
            if (modFlags == 2) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
              ::_M_erase_aux(&this_00->_M_t,(const_iterator)__position._M_node);
              bVar4 = false;
            }
          }
        }
        if (!bVar4) {
          return 1;
        }
      }
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    } while (__position._M_node != iVar7._M_node);
  }
  if (!(bool)(modFlags != 1 | bVar3)) {
    pcVar2 = (entry->mValue)._M_dataplus._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar2,pcVar2 + (entry->mValue)._M_string_length);
    pcVar2 = (entry->mSecret)._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,pcVar2 + (entry->mSecret)._M_string_length);
    bdHashEntry::bdHashEntry(&local_f0,&local_110,&local_130,entry->mLifetime,store);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bdHashEntry_&,_true>
              (&local_a0,key,&local_f0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bdHashEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bdHashEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,bdHashEntry>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bdHashEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bdHashEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
                *)this_00,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.second.mSecret._M_dataplus._M_p != &local_a0.second.mSecret.field_2) {
      operator_delete(local_a0.second.mSecret._M_dataplus._M_p,
                      local_a0.second.mSecret.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.second.mValue._M_dataplus._M_p != &local_a0.second.mValue.field_2) {
      operator_delete(local_a0.second.mValue._M_dataplus._M_p,
                      local_a0.second.mValue.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.mSecret._M_dataplus._M_p != &local_f0.mSecret.field_2) {
      operator_delete(local_f0.mSecret._M_dataplus._M_p,
                      local_f0.mSecret.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.mValue._M_dataplus._M_p != &local_f0.mValue.field_2) {
      operator_delete(local_f0.mValue._M_dataplus._M_p,
                      local_f0.mValue.field_2._M_allocated_capacity + 1);
    }
    bVar3 = 1;
  }
  return (uint)bVar3;
}

Assistant:

int 	bdHashSet::modify(std::string key, bdHashEntry *entry, uint32_t modFlags) {
	std::multimap<std::string, bdHashEntry>::iterator sit, eit, it;
        sit = mEntries.lower_bound(key);
        eit = mEntries.upper_bound(key);

	time_t now = time(NULL);

	bool updated = false;
	for (it = sit; it != eit; it++) {
		/* check it all */
		if (it->second.mValue == entry->mValue) {
			bool noSecret = (it->second.mSecret == "");
			bool sameSecret = (it->second.mSecret == entry->mSecret);
			bool update = false;

			if (noSecret && sameSecret) {
				/* only allowed to increase lifetime */
				if (modFlags == BITDHT_HASH_ENTRY_ADD) {
					time_t existKillTime = it->second.mLifetime + it->second.mStoreTS;
					time_t newKillTime = entry->mLifetime + now;
					if (newKillTime > existKillTime) {
						update = true;
					}
				}
			}
			else if (sameSecret) {
				if (modFlags == BITDHT_HASH_ENTRY_ADD) {
					update = true;
				}
				else if (modFlags == BITDHT_HASH_ENTRY_DELETE) {
					/* do it here */
					mEntries.erase(it);
					return 1;
				}
			}
			
			if (update) {
				it->second.mStoreTS = now;
				it->second.mLifetime = entry->mLifetime;
				updated = true;
			}
		}
	}

	if ((!updated) && (modFlags == BITDHT_HASH_ENTRY_ADD)) {
		/* create a new entry */
		bdHashEntry newEntry(entry->mValue, entry->mSecret, entry->mLifetime, now);
	        mEntries.insert(std::pair<std::string, bdHashEntry>(key, newEntry));
		updated = true;
	}
	return updated;
}